

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,ProgramNode *node)

{
  _List_node_base *p_Var1;
  optional<std::reference_wrapper<Symbol>_> oVar2;
  FunctionAnalyser analyser;
  allocator<char> local_79;
  string local_78;
  FunctionAnalyser local_58;
  
  p_Var1 = (_List_node_base *)&node->variables_;
  while (p_Var1 = (((_List_base<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&node->variables_) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x10))(p_Var1[1]._M_next,this);
  }
  p_Var1 = (_List_node_base *)&node->functions_;
  while (p_Var1 = (((_List_base<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&node->functions_) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x10))(p_Var1[1]._M_next,this);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"main",(allocator<char> *)&local_78);
  oVar2 = SymbolTable::lookup(&this->symbols_,(string *)&local_58,0);
  std::__cxx11::string::~string((string *)&local_58);
  if (((undefined1  [16])
       oVar2.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Main function was not found!",(allocator<char> *)&local_78);
    reportError((string *)&local_58,&node->super_Node);
  }
  FunctionAnalyser::FunctionAnalyser(&local_58);
  (**(code **)(*(long *)oVar2.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                        _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                        _M_payload + 0x10))
            (oVar2.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,&local_58);
  if (local_58.symbolValid_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Symbol main does not name a function!",&local_79);
    reportError(&local_78,&node->super_Node);
  }
  if (((ulong)local_58.returnType_.super__Optional_base<TypeName,_true,_true>._M_payload.
              super__Optional_payload_base<TypeName> & 0x1ffffffff) == 0x100000000) {
    FunctionAnalyser::~FunctionAnalyser(&local_58);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Main should return F32!",&local_79);
  reportError(&local_78,&node->super_Node);
}

Assistant:

void SemanticAnalyser::visit(const ProgramNode& node) 
{
  for(const auto& var : node.getVariables())
    var->accept(*this);
  
  for(const auto& func : node.getFunctions())
    func->accept(*this);

  const auto symbol = symbols_.lookup("main");
  if(!symbol)
    reportError("Main function was not found!", node);
  
  FunctionAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Symbol main does not name a function!", node);
  else if(analyser.getReturnType() != TypeName::F32)
    reportError("Main should return F32!", node);
}